

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int ssl_double_retransmit_timeout(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = ssl->handshake->retransmit_timeout;
  uVar2 = ssl->conf->hs_timeout_max;
  iVar4 = -1;
  if (uVar1 < uVar2) {
    uVar3 = uVar1 * 2;
    if (uVar2 <= uVar1 * 2) {
      uVar3 = uVar2;
    }
    if ((int)uVar1 < 0) {
      uVar3 = uVar2;
    }
    ssl->handshake->retransmit_timeout = uVar3;
    iVar4 = 0;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x7f,"update timeout value to %d millisecs");
  }
  return iVar4;
}

Assistant:

static int ssl_double_retransmit_timeout( mbedtls_ssl_context *ssl )
{
    uint32_t new_timeout;

    if( ssl->handshake->retransmit_timeout >= ssl->conf->hs_timeout_max )
        return( -1 );

    new_timeout = 2 * ssl->handshake->retransmit_timeout;

    /* Avoid arithmetic overflow and range overflow */
    if( new_timeout < ssl->handshake->retransmit_timeout ||
        new_timeout > ssl->conf->hs_timeout_max )
    {
        new_timeout = ssl->conf->hs_timeout_max;
    }

    ssl->handshake->retransmit_timeout = new_timeout;
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "update timeout value to %d millisecs",
                        ssl->handshake->retransmit_timeout ) );

    return( 0 );
}